

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

void __thiscall ON_OutlineAccumulator::Clear(ON_OutlineAccumulator *this)

{
  ON_Outline *this_00;
  ON_OutlineAccumulator *this_local;
  
  if (*(long *)(this + 0x58) != 0) {
    if (*(long *)(this + 0x50) == *(long *)(this + 0x58)) {
      *(undefined8 *)(this + 0x50) = 0;
    }
    this_00 = *(ON_Outline **)(this + 0x58);
    if (this_00 != (ON_Outline *)0x0) {
      ON_Outline::~ON_Outline(this_00);
      operator_delete(this_00,0x78);
    }
    *(undefined8 *)(this + 0x58) = 0;
  }
  if (*(long *)(this + 0x50) != 0) {
    ON_Outline::operator=(*(ON_Outline **)(this + 0x50),&ON_Outline::Unset);
  }
  *(undefined4 *)this = 0;
  this[4] = (ON_OutlineAccumulator)0x0;
  this[5] = (ON_OutlineAccumulator)0x0;
  *(undefined4 *)(this + 8) = 0;
  *(undefined4 *)(this + 0xc) = 0;
  AbandonCurrentFigure(this);
  return;
}

Assistant:

void ON_OutlineAccumulator::Clear()
{
  if (m_managed_outline)
  {
    if (m_outline == m_managed_outline)
      m_outline = nullptr;
    delete m_managed_outline;
    m_managed_outline = nullptr;
  }

  if ( nullptr != m_outline)
    *m_outline = ON_Outline::Unset;

  m_units_per_em = 0;
  m_status = 0;
  m_figure_type = ON_OutlineFigure::Type::Unset;
  m_figure_depth = 0;
  m_error_count = 0;

  AbandonCurrentFigure();
}